

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

ConversionResult
llvm::ConvertUTF32toUTF8
          (UTF32 **sourceStart,UTF32 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  UTF8 *pUVar1;
  UTF32 byteMark;
  UTF32 byteMask;
  unsigned_short bytesToWrite;
  UTF8 *pUStack_40;
  UTF32 ch;
  UTF8 *target;
  UTF32 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF8 *targetEnd_local;
  UTF8 **targetStart_local;
  UTF32 *sourceEnd_local;
  UTF32 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  pUStack_40 = *targetStart;
  target = (UTF8 *)*sourceStart;
  do {
    if (sourceEnd <= target) {
LAB_002c090e:
      *sourceStart = (UTF32 *)target;
      *targetStart = pUStack_40;
      return (ConversionResult)source;
    }
    byteMask = *(UTF32 *)target;
    if (((flags == strictConversion) && (0xd7ff < byteMask)) && (byteMask < 0xe000)) {
      source._0_4_ = sourceIllegal;
      goto LAB_002c090e;
    }
    if (byteMask < 0x80) {
      byteMark._2_2_ = 1;
    }
    else if (byteMask < 0x800) {
      byteMark._2_2_ = 2;
    }
    else if (byteMask < 0x10000) {
      byteMark._2_2_ = 3;
    }
    else if (byteMask < 0x110000) {
      byteMark._2_2_ = 4;
    }
    else {
      byteMark._2_2_ = 3;
      byteMask = 0xfffd;
      source._0_4_ = sourceIllegal;
    }
    pUVar1 = pUStack_40 + (int)(uint)byteMark._2_2_;
    if (targetEnd < pUVar1) {
      pUStack_40 = pUVar1 + -(long)(int)(uint)byteMark._2_2_;
      source._0_4_ = targetExhausted;
      goto LAB_002c090e;
    }
    pUStack_40 = pUVar1;
    switch(byteMark._2_2_) {
    case 4:
      pUStack_40 = pUVar1 + -1;
      pUVar1[-1] = (byte)byteMask & 0xbf | 0x80;
      byteMask = byteMask >> 6;
    case 3:
      pUStack_40[-1] = (byte)byteMask & 0xbf | 0x80;
      byteMask = byteMask >> 6;
      pUStack_40 = pUStack_40 + -1;
    case 2:
      pUStack_40[-1] = (byte)byteMask & 0xbf | 0x80;
      byteMask = byteMask >> 6;
      pUStack_40 = pUStack_40 + -1;
    case 1:
      pUStack_40[-1] = (byte)byteMask | *(byte *)((long)&firstByteMark + (ulong)byteMark._2_2_);
      pUStack_40 = pUStack_40 + -1;
    default:
      pUStack_40 = pUStack_40 + (int)(uint)byteMark._2_2_;
      target = target + 4;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF32toUTF8 (
        const UTF32** sourceStart, const UTF32* sourceEnd,
        UTF8** targetStart, UTF8* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF32* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        unsigned short bytesToWrite = 0;
        const UTF32 byteMask = 0xBF;
        const UTF32 byteMark = 0x80;
        ch = *source++;
        if (flags == strictConversion ) {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                --source; /* return to the illegal value itself */
                result = sourceIllegal;
                break;
            }
        }
        /*
         * Figure out how many bytes the result will require. Turn any
         * illegally large UTF32 things (> Plane 17) into replacement chars.
         */
        if (ch < (UTF32)0x80) {      bytesToWrite = 1;
        } else if (ch < (UTF32)0x800) {     bytesToWrite = 2;
        } else if (ch < (UTF32)0x10000) {   bytesToWrite = 3;
        } else if (ch <= UNI_MAX_LEGAL_UTF32) {  bytesToWrite = 4;
        } else {                            bytesToWrite = 3;
                                            ch = UNI_REPLACEMENT_CHAR;
                                            result = sourceIllegal;
        }

        target += bytesToWrite;
        if (target > targetEnd) {
            --source; /* Back up source pointer! */
            target -= bytesToWrite; result = targetExhausted; break;
        }
        switch (bytesToWrite) { /* note: everything falls through. */
            case 4: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 3: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 2: *--target = (UTF8)((ch | byteMark) & byteMask); ch >>= 6;
            case 1: *--target = (UTF8) (ch | firstByteMark[bytesToWrite]);
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}